

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O2

void __thiscall FIX::FileStore::reset(FileStore *this)

{
  int __oflag;
  
  MemoryStore::reset(&this->m_cache);
  open(this,(char *)0x1,__oflag);
  setSession(this);
  return;
}

Assistant:

void FileStore::reset() EXCEPT ( IOException )
{
  try
  {
    m_cache.reset();
    open( true );
    setSession();
  }
  catch( std::exception& e )
  {
    throw IOException( e.what() );
  }
}